

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

string * cmCTest::CleanString(string *__return_storage_ptr__,string *str,size_type spos)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)str,0x88dacd,spos);
  std::__cxx11::string::find_last_not_of((char *)str,0x88dacd,0xffffffffffffffff);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::CleanString(const std::string& str,
                                 std::string::size_type spos)
{
  spos = str.find_first_not_of(" \n\t\r\f\v", spos);
  std::string::size_type epos = str.find_last_not_of(" \n\t\r\f\v");
  if (spos == std::string::npos) {
    return std::string();
  }
  if (epos != std::string::npos) {
    epos = epos - spos + 1;
  }
  return str.substr(spos, epos);
}